

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

Error * ot::commissioner::CommissionerImpl::DecodeCommissionerDataset
                  (Error *__return_storage_ptr__,CommissionerDataset *aDataset,Response *aResponse)

{
  bool bVar1;
  Error *aError;
  mapped_type *pmVar2;
  ByteArray *pBVar3;
  element_type *peVar4;
  key_type local_1a1;
  undefined1 local_1a0 [8];
  mapped_type nmkpUdpPort;
  undefined1 local_188 [8];
  mapped_type aeUdpPort;
  undefined1 local_170 [8];
  mapped_type joinerUdpPort;
  undefined1 local_158 [8];
  mapped_type nmkpSteeringData;
  undefined1 local_140 [8];
  mapped_type aeSteeringData;
  undefined1 local_128 [8];
  mapped_type steeringData;
  undefined1 local_110 [8];
  mapped_type borderAgentLocator;
  undefined1 local_f8 [8];
  mapped_type sessionId;
  Error local_d8;
  undefined1 local_b0 [8];
  CommissionerDataset dataset;
  TlvSet tlvSet;
  Response *aResponse_local;
  CommissionerDataset *aDataset_local;
  Error *error;
  
  Error::Error(__return_storage_ptr__);
  std::
  map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  ::map((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
         *)&dataset.mJoinerUdpPort);
  CommissionerDataset::CommissionerDataset((CommissionerDataset *)local_b0);
  GetTlvSet(&local_d8,(TlvSet *)&dataset.mJoinerUdpPort,aResponse,kMeshCoP);
  aError = Error::operator=(__return_storage_ptr__,&local_d8);
  sessionId.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._0_4_ = 0;
  bVar1 = commissioner::operator!=
                    (aError,(ErrorCode *)
                            &sessionId.
                             super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount);
  Error::~Error(&local_d8);
  if (!bVar1) {
    borderAgentLocator.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._7_1_ = 0xb;
    pmVar2 = std::
             map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
             ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                           *)&dataset.mJoinerUdpPort,
                          (key_type *)
                          ((long)&borderAgentLocator.
                                  super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi + 7));
    std::shared_ptr<ot::commissioner::tlv::Tlv>::shared_ptr
              ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_f8,pmVar2);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_f8);
    if (bVar1) {
      peVar4 = std::
               __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_f8);
      local_b0._2_2_ = tlv::Tlv::GetValueAsUint16(peVar4);
      dataset.mNmkpSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._6_2_ =
           dataset.mNmkpSteeringData.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._6_2_ | 0x4000;
    }
    std::shared_ptr<ot::commissioner::tlv::Tlv>::~shared_ptr
              ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_f8);
    steeringData.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._7_1_ = 9;
    pmVar2 = std::
             map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
             ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                           *)&dataset.mJoinerUdpPort,
                          (key_type *)
                          ((long)&steeringData.
                                  super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi + 7));
    std::shared_ptr<ot::commissioner::tlv::Tlv>::shared_ptr
              ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_110,pmVar2);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_110);
    if (bVar1) {
      peVar4 = std::
               __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_110);
      local_b0._0_2_ = tlv::Tlv::GetValueAsUint16(peVar4);
      dataset.mNmkpSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._6_2_ =
           dataset.mNmkpSteeringData.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._6_2_ | 0x8000;
    }
    std::shared_ptr<ot::commissioner::tlv::Tlv>::~shared_ptr
              ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_110);
    aeSteeringData.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._7_1_ = 8;
    pmVar2 = std::
             map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
             ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                           *)&dataset.mJoinerUdpPort,
                          (key_type *)
                          ((long)&aeSteeringData.
                                  super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi + 7));
    std::shared_ptr<ot::commissioner::tlv::Tlv>::shared_ptr
              ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_128,pmVar2);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_128);
    if (bVar1) {
      peVar4 = std::
               __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_128);
      pBVar3 = tlv::Tlv::GetValue(peVar4);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dataset,pBVar3);
      dataset.mNmkpSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._6_2_ =
           dataset.mNmkpSteeringData.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._6_2_ | 0x2000;
    }
    std::shared_ptr<ot::commissioner::tlv::Tlv>::~shared_ptr
              ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_128);
    nmkpSteeringData.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._7_1_ = 0x3d;
    pmVar2 = std::
             map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
             ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                           *)&dataset.mJoinerUdpPort,
                          (key_type *)
                          ((long)&nmkpSteeringData.
                                  super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi + 7));
    std::shared_ptr<ot::commissioner::tlv::Tlv>::shared_ptr
              ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_140,pmVar2);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_140);
    if (bVar1) {
      peVar4 = std::
               __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_140);
      pBVar3 = tlv::Tlv::GetValue(peVar4);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &dataset.mSteeringData.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,pBVar3);
      dataset.mNmkpSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._6_2_ =
           dataset.mNmkpSteeringData.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._6_2_ | 0x1000;
    }
    std::shared_ptr<ot::commissioner::tlv::Tlv>::~shared_ptr
              ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_140);
    joinerUdpPort.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._7_1_ = 0x3e;
    pmVar2 = std::
             map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
             ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                           *)&dataset.mJoinerUdpPort,
                          (key_type *)
                          ((long)&joinerUdpPort.
                                  super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi + 7));
    std::shared_ptr<ot::commissioner::tlv::Tlv>::shared_ptr
              ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_158,pmVar2);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_158);
    if (bVar1) {
      peVar4 = std::
               __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_158);
      pBVar3 = tlv::Tlv::GetValue(peVar4);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &dataset.mAeSteeringData.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,pBVar3);
      dataset.mNmkpSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._6_2_ =
           dataset.mNmkpSteeringData.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._6_2_ | 0x800;
    }
    std::shared_ptr<ot::commissioner::tlv::Tlv>::~shared_ptr
              ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_158);
    aeUdpPort.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi._7_1_ = 0x12;
    pmVar2 = std::
             map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
             ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                           *)&dataset.mJoinerUdpPort,
                          (key_type *)
                          ((long)&aeUdpPort.
                                  super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi + 7));
    std::shared_ptr<ot::commissioner::tlv::Tlv>::shared_ptr
              ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_170,pmVar2);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_170);
    if (bVar1) {
      peVar4 = std::
               __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_170);
      dataset.mNmkpSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = tlv::Tlv::GetValueAsUint16(peVar4);
      dataset.mNmkpSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._6_2_ =
           dataset.mNmkpSteeringData.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._6_2_ | 0x400;
    }
    std::shared_ptr<ot::commissioner::tlv::Tlv>::~shared_ptr
              ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_170);
    nmkpUdpPort.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._7_1_ = 0x41;
    pmVar2 = std::
             map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
             ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                           *)&dataset.mJoinerUdpPort,
                          (key_type *)
                          ((long)&nmkpUdpPort.
                                  super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi + 7));
    std::shared_ptr<ot::commissioner::tlv::Tlv>::shared_ptr
              ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_188,pmVar2);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_188);
    if (bVar1) {
      peVar4 = std::
               __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_188);
      dataset.mNmkpSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._2_2_ = tlv::Tlv::GetValueAsUint16(peVar4);
      dataset.mNmkpSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._6_2_ =
           dataset.mNmkpSteeringData.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._6_2_ | 0x200;
    }
    std::shared_ptr<ot::commissioner::tlv::Tlv>::~shared_ptr
              ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_188);
    local_1a1 = kNmkpUdpPort;
    pmVar2 = std::
             map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
             ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                           *)&dataset.mJoinerUdpPort,&local_1a1);
    std::shared_ptr<ot::commissioner::tlv::Tlv>::shared_ptr
              ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_1a0,pmVar2);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_1a0);
    if (bVar1) {
      peVar4 = std::
               __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_1a0);
      dataset.mNmkpSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_2_ = tlv::Tlv::GetValueAsUint16(peVar4);
      dataset.mNmkpSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._6_2_ =
           dataset.mNmkpSteeringData.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._6_2_ | 0x100;
    }
    std::shared_ptr<ot::commissioner::tlv::Tlv>::~shared_ptr
              ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_1a0);
    CommissionerDataset::operator=(aDataset,(CommissionerDataset *)local_b0);
  }
  CommissionerDataset::~CommissionerDataset((CommissionerDataset *)local_b0);
  std::
  map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  ::~map((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
          *)&dataset.mJoinerUdpPort);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerImpl::DecodeCommissionerDataset(CommissionerDataset &aDataset, const coap::Response &aResponse)
{
    Error               error;
    tlv::TlvSet         tlvSet;
    CommissionerDataset dataset;

    SuccessOrExit(error = GetTlvSet(tlvSet, aResponse));

    if (auto sessionId = tlvSet[tlv::Type::kCommissionerSessionId])
    {
        dataset.mSessionId = sessionId->GetValueAsUint16();
        dataset.mPresentFlags |= CommissionerDataset::kSessionIdBit;
    }

    if (auto borderAgentLocator = tlvSet[tlv::Type::kBorderAgentLocator])
    {
        dataset.mBorderAgentLocator = borderAgentLocator->GetValueAsUint16();
        dataset.mPresentFlags |= CommissionerDataset::kBorderAgentLocatorBit;
    }

    if (auto steeringData = tlvSet[tlv::Type::kSteeringData])
    {
        dataset.mSteeringData = steeringData->GetValue();
        dataset.mPresentFlags |= CommissionerDataset::kSteeringDataBit;
    }

    if (auto aeSteeringData = tlvSet[tlv::Type::kAeSteeringData])
    {
        dataset.mAeSteeringData = aeSteeringData->GetValue();
        dataset.mPresentFlags |= CommissionerDataset::kAeSteeringDataBit;
    }

    if (auto nmkpSteeringData = tlvSet[tlv::Type::kNmkpSteeringData])
    {
        dataset.mNmkpSteeringData = nmkpSteeringData->GetValue();
        dataset.mPresentFlags |= CommissionerDataset::kNmkpSteeringDataBit;
    }

    if (auto joinerUdpPort = tlvSet[tlv::Type::kJoinerUdpPort])
    {
        dataset.mJoinerUdpPort = joinerUdpPort->GetValueAsUint16();
        dataset.mPresentFlags |= CommissionerDataset::kJoinerUdpPortBit;
    }

    if (auto aeUdpPort = tlvSet[tlv::Type::kAeUdpPort])
    {
        dataset.mAeUdpPort = aeUdpPort->GetValueAsUint16();
        dataset.mPresentFlags |= CommissionerDataset::kAeUdpPortBit;
    }

    if (auto nmkpUdpPort = tlvSet[tlv::Type::kNmkpUdpPort])
    {
        dataset.mNmkpUdpPort = nmkpUdpPort->GetValueAsUint16();
        dataset.mPresentFlags |= CommissionerDataset::kNmkpUdpPortBit;
    }

    aDataset = dataset;

exit:
    return error;
}